

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

Value * __thiscall
BasicBlock::UpdateValueForCopyTypeInstr
          (BasicBlock *this,GlobOpt *globOpt,GlobHashTable *localSymToValueMap,Instr *instr)

{
  Opnd *pOVar1;
  _func_int **pp_Var2;
  IntConstOpnd *this_00;
  AddrOpnd *addrOpnd;
  code *pcVar3;
  OpndKind OVar4;
  bool bVar5;
  int32 intConst;
  undefined4 *puVar6;
  Value *pVVar7;
  PropertySym *srcSym;
  StackSym *pSVar8;
  Sym *pSVar9;
  Value **ppVVar10;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType src1Value;
  
  if (instr->m_opcode == LdFld) {
    OVar4 = IR::Opnd::GetKind(instr->m_src1);
    if (OVar4 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x11e9,"(instr->GetSrc1()->IsSymOpnd())","instr->GetSrc1()->IsSymOpnd()");
      if (!bVar5) goto LAB_0041c12d;
      *puVar6 = 0;
    }
    pOVar1 = instr->m_src1;
    OVar4 = IR::Opnd::GetKind(pOVar1);
    if (OVar4 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar5) goto LAB_0041c12d;
      *puVar6 = 0;
    }
    pp_Var2 = pOVar1[1]._vptr_Opnd;
    if (*(char *)((long)pp_Var2 + 0x14) == '\x02') {
      pVVar7 = FindValueInLocalThenGlobalValueTableAndUpdate
                         (this,globOpt,localSymToValueMap,instr,(Sym *)0x0,(Sym *)pp_Var2[4]);
      if ((pVVar7 == (Value *)0x0) || (pSVar9 = pVVar7->valueInfo->symStore, pSVar9 == (Sym *)0x0))
      {
        pSVar9 = (Sym *)pp_Var2[4];
      }
      srcSym = PropertySym::Find(pSVar9->m_id,*(int32 *)(pp_Var2 + 3),globOpt->func);
      pSVar8 = IR::Opnd::GetStackSym(instr->m_dst);
      if (srcSym != (PropertySym *)0x0) goto LAB_0041bee8;
      ppVVar10 = ValueHashTable<Sym_*,_Value_*>::FindOrInsertNew
                           (localSymToValueMap,&pSVar8->super_Sym);
      *ppVVar10 = (Value *)0x0;
    }
    pVVar7 = (Value *)0x0;
  }
  else {
    pSVar8 = IR::Opnd::GetStackSym(instr->m_src1);
    if (pSVar8 != (StackSym *)0x0) {
      srcSym = (PropertySym *)IR::Opnd::GetStackSym(instr->m_src1);
      pSVar8 = (StackSym *)IR::Opnd::GetSym(instr->m_dst);
LAB_0041bee8:
      pVVar7 = FindValueInLocalThenGlobalValueTableAndUpdate
                         (this,globOpt,localSymToValueMap,instr,&pSVar8->super_Sym,
                          &srcSym->super_Sym);
      return pVVar7;
    }
    OVar4 = IR::Opnd::GetKind(instr->m_src1);
    if (OVar4 == OpndKindIntConst) {
      pSVar9 = IR::Opnd::GetSym(instr->m_dst);
      ppVVar10 = ValueHashTable<Sym_*,_Value_*>::FindOrInsertNew(localSymToValueMap,pSVar9);
      this_00 = (IntConstOpnd *)instr->m_src1;
      OVar4 = IR::Opnd::GetKind((Opnd *)this_00);
      if (OVar4 != OpndKindIntConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
        if (!bVar5) {
LAB_0041c12d:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar6 = 0;
      }
      intConst = IR::IntConstOpnd::AsInt32(this_00);
      pVVar7 = GlobOpt::GetIntConstantValue(globOpt,intConst,instr,(Opnd *)0x0);
    }
    else {
      OVar4 = IR::Opnd::GetKind(instr->m_src1);
      if (OVar4 == OpndKindInt64Const) {
        pSVar9 = IR::Opnd::GetSym(instr->m_dst);
        ppVVar10 = ValueHashTable<Sym_*,_Value_*>::FindOrInsertNew(localSymToValueMap,pSVar9);
        pOVar1 = instr->m_src1;
        OVar4 = IR::Opnd::GetKind(pOVar1);
        if (OVar4 != OpndKindInt64Const) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0xe4,"(this->IsInt64ConstOpnd())","Bad call to AsInt64ConstOpnd()");
          if (!bVar5) goto LAB_0041c12d;
          *puVar6 = 0;
        }
        pVVar7 = GlobOpt::GetIntConstantValue(globOpt,(int64)pOVar1[1]._vptr_Opnd,instr,(Opnd *)0x0)
        ;
      }
      else {
        local_32[0] = (instr->m_src1->m_valueType).field_0;
        pSVar9 = IR::Opnd::GetSym(instr->m_dst);
        ppVVar10 = ValueHashTable<Sym_*,_Value_*>::FindOrInsertNew(localSymToValueMap,pSVar9);
        bVar5 = ValueType::IsUndefined((ValueType *)&local_32[0].field_0);
        if ((bVar5) || (bVar5 = ValueType::IsBoolean((ValueType *)&local_32[0].field_0), bVar5)) {
          addrOpnd = (AddrOpnd *)instr->m_src1;
          OVar4 = IR::Opnd::GetKind((Opnd *)addrOpnd);
          if (OVar4 != OpndKindAddr) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar6 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
            if (!bVar5) goto LAB_0041c12d;
            *puVar6 = 0;
          }
          pVVar7 = GlobOpt::GetVarConstantValue(globOpt,addrOpnd);
        }
        else {
          pVVar7 = (Value *)0x0;
        }
      }
    }
    *ppVVar10 = pVVar7;
  }
  return pVVar7;
}

Assistant:

Value*
BasicBlock::UpdateValueForCopyTypeInstr(GlobOpt* globOpt, GlobHashTable* localSymToValueMap, IR::Instr* instr)
{
    Value* dstValue = nullptr;
    if (instr->m_opcode == Js::OpCode::LdFld)
    {
        // Special handling for LdFld
        Assert(instr->GetSrc1()->IsSymOpnd());
        IR::SymOpnd* symOpnd = instr->GetSrc1()->AsSymOpnd();

        if (symOpnd->m_sym->IsPropertySym())
        {
            PropertySym* originalPropertySym = symOpnd->m_sym->AsPropertySym();
            Value* const objectValue = FindValueInLocalThenGlobalValueTableAndUpdate(globOpt, localSymToValueMap, instr, nullptr, originalPropertySym->m_stackSym);
            Sym* objSym = objectValue ? objectValue->GetValueInfo()->GetSymStore() : nullptr;
            PropertySym* prop = PropertySym::Find(objSym ? objSym->m_id : originalPropertySym->m_stackSym->m_id, originalPropertySym->m_propertyId, globOpt->func);
            if (prop)
            {
                dstValue = FindValueInLocalThenGlobalValueTableAndUpdate(globOpt, localSymToValueMap, instr, instr->GetDst()->GetStackSym(), prop);
            }
            else
            {
                Value** localDstValue = localSymToValueMap->FindOrInsertNew(instr->GetDst()->GetStackSym());
                dstValue = *localDstValue = nullptr;
            }
        }
    }
    else if (instr->GetSrc1()->GetStackSym())
    {
        StackSym* src1Sym = instr->GetSrc1()->GetStackSym();
        dstValue = FindValueInLocalThenGlobalValueTableAndUpdate(globOpt, localSymToValueMap, instr, instr->GetDst()->GetSym(), src1Sym);
    }
    else if (instr->GetSrc1()->IsIntConstOpnd())
    {
        Value** localValue = localSymToValueMap->FindOrInsertNew(instr->GetDst()->GetSym());
        dstValue = *localValue = globOpt->GetIntConstantValue(instr->GetSrc1()->AsIntConstOpnd()->AsInt32(), instr);
    }
    else if (instr->GetSrc1()->IsInt64ConstOpnd())
    {
        Value** localValue = localSymToValueMap->FindOrInsertNew(instr->GetDst()->GetSym());
        dstValue = *localValue = globOpt->GetIntConstantValue(instr->GetSrc1()->AsInt64ConstOpnd()->GetValue(), instr);
    }
    else
    {
        ValueType src1Value = instr->GetSrc1()->GetValueType();
        Value** localValue = localSymToValueMap->FindOrInsertNew(instr->GetDst()->GetSym());
        if (src1Value.IsUndefined() || src1Value.IsBoolean())
        {
            dstValue = *localValue = globOpt->GetVarConstantValue(instr->GetSrc1()->AsAddrOpnd());
        }
        else
        {
            dstValue = *localValue = nullptr;
        }
    }
    return dstValue;
}